

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_interp_CC_to_FaceCentroid
               (MultiFab *cc,MultiFab *fc_x,MultiFab *fc_y,MultiFab *fc_z,int scomp,int dcomp,
               int ncomp,Geometry *a_geom,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *a_bcs
               )

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  FabFactory<amrex::FArrayBox> *pFVar6;
  Long LVar7;
  Box *pBVar8;
  FabArray<amrex::FArrayBox> *in_RCX;
  literals *in_RDX;
  literals *in_RSI;
  literals *this;
  int in_stack_00000008;
  Geometry *in_stack_00000010;
  Box tzbx_1;
  iterator __end5_5;
  iterator __begin5_5;
  range_impl<amrex::Box> *__range5_5;
  Box tybx_1;
  iterator __end5_4;
  iterator __begin5_4;
  range_impl<amrex::Box> *__range5_4;
  Box txbx_1;
  iterator __end5_3;
  iterator __begin5_3;
  range_impl<amrex::Box> *__range5_3;
  Array4<const_double> *fcz;
  Array4<const_double> *fcy;
  Array4<const_double> *fcx;
  Array4<const_double> *apzfab;
  Array4<const_double> *apyfab;
  Array4<const_double> *apxfab;
  Box tzbx;
  iterator __end5_2;
  iterator __begin5_2;
  range_impl<amrex::Box> *__range5_2;
  Box tybx;
  iterator __end5_1;
  iterator __begin5_1;
  range_impl<amrex::Box> *__range5_1;
  Box txbx;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  Array4<double> *edg_z;
  Array4<double> *edg_y;
  Array4<double> *edg_x;
  Box result_1;
  FabType fabtyp_ghost;
  Box result;
  FabType fabtyp;
  Array4<const_double> *ccfab;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  Box *vbx;
  MFIter mfi;
  MFItInfo mfi_info;
  BCRec *d_bcs;
  int nghost;
  Box domain;
  Array<const_MultiCutFab_*,_3> *fcent;
  Array<const_MultiCutFab_*,_3> *area;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  Dim3 domhi;
  Dim3 domlo;
  Dim3 domhi_1;
  Dim3 domlo_1;
  Dim3 domhi_2;
  Dim3 domlo_2;
  Dim3 domhi_3;
  Dim3 domlo_3;
  Dim3 domhi_4;
  Dim3 domlo_4;
  Dim3 domhi_5;
  Dim3 domlo_5;
  MFIter *mfi_00;
  undefined2 in_stack_ffffffffffffea60;
  undefined2 uVar9;
  undefined2 in_stack_ffffffffffffea62;
  int in_stack_ffffffffffffea64;
  MFIter *in_stack_ffffffffffffea68;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffea70;
  undefined1 uVar10;
  uint in_stack_ffffffffffffea78;
  int in_stack_ffffffffffffea7c;
  undefined4 uVar11;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffea80;
  FabArrayBase *in_stack_ffffffffffffea88;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffea90;
  anon_class_296_7_5d001a28 *in_stack_ffffffffffffeaa8;
  int in_stack_ffffffffffffeab4;
  MFIter *in_stack_ffffffffffffeab8;
  MFIter *in_stack_ffffffffffffeac0;
  int in_stack_ffffffffffffeacc;
  MFIter *in_stack_ffffffffffffead0;
  undefined4 in_stack_ffffffffffffeb80;
  undefined4 in_stack_ffffffffffffeb84;
  EBCellFlagFab *in_stack_ffffffffffffeb88;
  iterator local_1440;
  iterator local_1428;
  undefined1 local_1410 [40];
  undefined1 *local_13e8;
  iterator local_13c0;
  iterator local_13a8;
  char *in_stack_ffffffffffffec78;
  int in_stack_ffffffffffffec84;
  char *in_stack_ffffffffffffec88;
  char *in_stack_ffffffffffffec90;
  undefined1 local_135c [52];
  iterator local_1328;
  undefined1 local_1310 [40];
  undefined1 *local_12e8;
  undefined1 local_12e0 [64];
  undefined1 *local_12a0;
  undefined1 local_1298 [64];
  undefined1 *local_1258;
  undefined1 local_1250 [64];
  undefined1 *local_1210;
  undefined1 local_1208 [64];
  undefined1 *local_11c8;
  undefined1 local_11c0 [64];
  undefined1 *local_1180;
  undefined1 local_1178 [64];
  undefined1 *local_1138;
  undefined1 local_112c [52];
  iterator local_10f8;
  undefined1 local_10e0 [40];
  undefined1 *local_10b8;
  Box local_10ac;
  iterator local_1090;
  iterator local_1078;
  undefined1 local_1060 [40];
  undefined1 *local_1038;
  Box local_102c;
  iterator local_1010;
  iterator local_ff8;
  undefined1 local_fe0 [40];
  undefined1 *local_fb8;
  undefined1 local_fb0 [64];
  undefined1 *local_f70;
  undefined1 local_f68 [64];
  undefined1 *local_f28;
  undefined1 local_f20 [64];
  undefined1 *local_ee0;
  Box local_ed8;
  FabType local_ebc;
  Box local_eb8;
  FabType local_e9c;
  undefined1 local_e98 [64];
  undefined1 *local_e58;
  undefined1 local_e4c [28];
  undefined1 *local_e30;
  undefined1 local_e24 [28];
  undefined1 *local_e08;
  undefined1 local_dfc [28];
  undefined1 *local_de0;
  int local_dd4 [7];
  int *local_db8;
  MFIter local_db0;
  MFItInfo local_d4c;
  BCRec *local_d38;
  undefined4 local_d30;
  undefined8 local_d2c;
  undefined8 local_d24;
  undefined8 local_d1c;
  uint local_d14;
  undefined1 local_d10 [24];
  undefined1 *local_cf8;
  undefined1 local_cf0 [24];
  undefined1 *local_cd8;
  FabArray<amrex::EBCellFlagFab> *local_cd0;
  long local_cc8;
  FabArray<amrex::FArrayBox> *local_cb8;
  undefined8 local_cb0;
  literals *local_ca8;
  undefined8 local_c98;
  undefined4 local_c8c;
  char *local_c88;
  char *local_c80;
  undefined4 local_c74;
  int *local_c70;
  undefined4 local_c64;
  int *local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  BCRec *local_c48;
  undefined1 auStack_c40 [64];
  undefined1 auStack_c00 [64];
  undefined8 local_bc0;
  undefined4 local_bb8;
  undefined8 local_bb0;
  undefined4 local_ba8;
  undefined8 local_b9c;
  undefined4 local_b94;
  undefined8 local_b90;
  undefined8 local_b88;
  undefined8 local_b80;
  undefined8 local_b78;
  BCRec *local_b70;
  undefined8 *local_b68;
  undefined1 *local_b58;
  undefined1 *local_b50;
  Box *local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined8 *local_b30;
  undefined4 local_b24;
  undefined4 uStack_b20;
  undefined1 local_b1c [12];
  undefined4 local_b10;
  undefined8 *local_b08;
  undefined4 local_afc;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  BCRec *local_ae0;
  undefined1 auStack_ad8 [64];
  undefined1 auStack_a98 [64];
  undefined8 local_a58;
  undefined4 local_a50;
  undefined8 local_a48;
  undefined4 local_a40;
  undefined8 local_a34;
  undefined4 local_a2c;
  undefined8 local_a28;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  BCRec *local_a08;
  undefined8 *local_a00;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  Box *local_9e0;
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined8 *local_9c8;
  undefined4 local_9bc;
  undefined4 uStack_9b8;
  undefined1 local_9b4 [12];
  undefined4 local_9a8;
  undefined8 *local_9a0;
  undefined4 local_994;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 local_980;
  BCRec *local_978;
  undefined1 auStack_970 [64];
  undefined1 auStack_930 [64];
  undefined8 local_8f0;
  undefined4 local_8e8;
  undefined8 local_8e0;
  undefined4 local_8d8;
  undefined8 local_8cc;
  undefined4 local_8c4;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  BCRec *local_8a0;
  undefined8 *local_898;
  undefined1 *local_888;
  undefined1 *local_880;
  MFIter *local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 *local_860;
  undefined4 local_854;
  undefined4 uStack_850;
  undefined1 local_84c [12];
  undefined4 local_840;
  undefined8 *local_838;
  undefined4 local_82c;
  undefined8 uStack_828;
  undefined1 local_820 [64];
  undefined1 auStack_7e0 [64];
  undefined8 local_7a0;
  undefined8 local_798;
  BCRec *local_790;
  undefined1 auStack_788 [64];
  undefined8 local_748;
  undefined4 local_740;
  undefined1 auStack_738 [64];
  undefined8 local_6f8;
  undefined4 local_6f0;
  undefined8 local_6e4;
  undefined4 local_6dc;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  BCRec *local_6b8;
  undefined8 *local_6b0;
  undefined1 *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  MFIter *local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 *local_668;
  undefined4 local_65c;
  undefined4 uStack_658;
  undefined1 local_654 [12];
  undefined4 local_648;
  undefined8 *local_640;
  undefined4 local_634;
  undefined8 uStack_630;
  undefined1 local_628 [64];
  undefined1 auStack_5e8 [64];
  undefined8 local_5a8;
  undefined8 local_5a0;
  BCRec *local_598;
  undefined1 auStack_590 [64];
  undefined8 local_550;
  undefined4 local_548;
  undefined1 auStack_540 [64];
  undefined8 local_500;
  undefined4 local_4f8;
  undefined8 local_4ec;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  BCRec *local_4c0;
  undefined8 *local_4b8;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  anon_class_296_7_5d001a28 *local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 *local_470;
  undefined4 local_464;
  undefined4 uStack_460;
  undefined1 local_45c [12];
  undefined4 local_450;
  undefined8 *local_448;
  undefined4 local_43c;
  undefined8 uStack_438;
  undefined1 local_430 [64];
  undefined1 auStack_3f0 [64];
  undefined8 local_3b0;
  undefined8 local_3a8;
  BCRec *local_3a0;
  undefined1 auStack_398 [64];
  undefined8 local_358;
  undefined4 local_350;
  undefined1 auStack_348 [64];
  undefined8 local_308;
  undefined4 local_300;
  undefined8 local_2f4;
  undefined4 local_2ec;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  BCRec *local_2c8;
  undefined8 *local_2c0;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  FabArray<amrex::FArrayBox> *local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 *local_278;
  undefined4 local_26c;
  undefined4 uStack_268;
  undefined1 local_264 [12];
  undefined4 local_258;
  undefined8 *local_250;
  undefined4 local_248;
  undefined8 uStack_244;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  undefined4 local_20c;
  undefined8 *local_208;
  undefined4 local_1fc;
  undefined8 *local_1f8;
  undefined4 local_1ec;
  undefined8 *local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  undefined4 local_1ac;
  undefined8 *local_1a8;
  undefined4 local_19c;
  undefined8 *local_198;
  undefined4 local_18c;
  undefined8 *local_188;
  undefined4 local_17c;
  long local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  undefined4 local_13c;
  undefined8 *local_138;
  undefined4 local_12c;
  undefined8 *local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  undefined8 *local_e8;
  undefined4 local_dc;
  undefined8 *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_cb8 = in_RCX;
  local_cb0 = in_RDX;
  local_ca8 = in_RSI;
  pFVar6 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x115ad4b);
  local_cc8 = __dynamic_cast(pFVar6,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
  if (local_cc8 != 0) {
    local_cd0 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)
                           CONCAT44(in_stack_ffffffffffffea64,
                                    CONCAT22(in_stack_ffffffffffffea62,in_stack_ffffffffffffea60)));
    EBFArrayBoxFactory::getAreaFrac
              ((EBFArrayBoxFactory *)
               CONCAT44(in_stack_ffffffffffffea64,
                        CONCAT22(in_stack_ffffffffffffea62,in_stack_ffffffffffffea60)));
    local_cd8 = local_cf0;
    EBFArrayBoxFactory::getFaceCent
              ((EBFArrayBoxFactory *)
               CONCAT44(in_stack_ffffffffffffea64,
                        CONCAT22(in_stack_ffffffffffffea62,in_stack_ffffffffffffea60)));
    local_cf8 = local_d10;
    LVar7 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::size
                      ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x115adf4);
    if (LVar7 != in_stack_00000008) {
      local_c80 = "a_bcs.size() == ncomp";
      local_c88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
      ;
      local_c8c = 0x39c;
      local_c98 = 0;
      Assert_host(in_stack_ffffffffffffec90,in_stack_ffffffffffffec88,in_stack_ffffffffffffec84,
                  in_stack_ffffffffffffec78);
    }
    pBVar8 = Geometry::Domain(in_stack_00000010);
    local_d2c = *(undefined8 *)(pBVar8->smallend).vect;
    uVar1 = *(undefined8 *)((pBVar8->smallend).vect + 2);
    local_d24._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    uVar2 = *(undefined8 *)((pBVar8->bigend).vect + 1);
    local_d1c._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    local_d14 = (pBVar8->btype).itype;
    local_d30 = 4;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    literals::operator____rt((literals *)in_stack_00000010,_DAT_016cb680);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffea90,(value_type)in_stack_ffffffffffffea88,
               (int)((ulong)in_stack_ffffffffffffea80 >> 0x20),(int)in_stack_ffffffffffffea80,
               in_stack_ffffffffffffea7c);
    this = local_cb0;
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    literals::operator____rt(local_ca8,_DAT_016cb680);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffea90,(value_type)in_stack_ffffffffffffea88,
               (int)((ulong)in_stack_ffffffffffffea80 >> 0x20),(int)in_stack_ffffffffffffea80,
               in_stack_ffffffffffffea7c);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    mfi_00 = SUB108(_DAT_016cb680,0);
    uVar9 = (undefined2)((unkuint10)_DAT_016cb680 >> 0x40);
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    literals::operator____rt(this,_DAT_016cb680);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffea90,(value_type)in_stack_ffffffffffffea88,
               (int)((ulong)in_stack_ffffffffffffea80 >> 0x20),(int)in_stack_ffffffffffffea80,
               in_stack_ffffffffffffea7c);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    local_d38 = Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                          ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x115af65);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffea70);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    MFItInfo::SetDynamic(&local_d4c,true);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    MFIter::MFIter((MFIter *)in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,
                   (MFItInfo *)in_stack_ffffffffffffea80);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    while( true ) {
      local_d1c = uVar2;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      uVar3 = local_d24._4_4_;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      bVar5 = MFIter::isValid(&local_db0);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_d24 = uVar1;
      local_d1c = uVar2;
      if (!bVar5) break;
      uVar3 = local_d24._4_4_;
      uVar4 = local_d1c._4_4_;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      MFIter::tilebox(in_stack_ffffffffffffeac0);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_db8 = local_dd4;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      MFIter::nodaltilebox(in_stack_ffffffffffffead0,in_stack_ffffffffffffeacc);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_de0 = local_dfc;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      MFIter::nodaltilebox(in_stack_ffffffffffffead0,in_stack_ffffffffffffeacc);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_e08 = local_e24;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      MFIter::nodaltilebox(in_stack_ffffffffffffead0,in_stack_ffffffffffffeacc);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_e30 = local_e4c;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea64);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_e58 = local_e98;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                 mfi_00);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_c60 = local_db8;
      local_c64 = 0;
      local_eb8.smallend.vect._0_8_ = *(undefined8 *)local_db8;
      local_eb8.smallend.vect[2] = local_db8[2];
      local_eb8.bigend.vect[0] = local_db8[3];
      local_eb8.bigend.vect._4_8_ = *(undefined8 *)(local_db8 + 4);
      local_eb8.btype.itype = local_db8[6];
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      Box::grow(&local_eb8,0);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      local_e9c = EBCellFlagFab::getType
                            (in_stack_ffffffffffffeb88,
                             (Box *)CONCAT44(in_stack_ffffffffffffeb84,in_stack_ffffffffffffeb80));
      uVar2 = local_d1c;
      uVar1 = local_d24;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      FabArray<amrex::EBCellFlagFab>::operator[]
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                 mfi_00);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      local_c70 = local_db8;
      local_c74 = 4;
      local_ed8.smallend.vect._0_8_ = *(undefined8 *)local_db8;
      local_ed8.smallend.vect[2] = local_db8[2];
      local_ed8.bigend.vect[0] = local_db8[3];
      local_ed8.bigend.vect._4_8_ = *(undefined8 *)(local_db8 + 4);
      local_ed8.btype.itype = local_db8[6];
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      Box::grow(&local_ed8,4);
      uVar2 = local_d1c;
      uVar1 = local_d24;
      uVar3 = local_d24._4_4_;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      local_d1c = uVar2;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      local_ebc = EBCellFlagFab::getType
                            (in_stack_ffffffffffffeb88,
                             (Box *)CONCAT44(in_stack_ffffffffffffeb84,in_stack_ffffffffffffeb80));
      uVar2 = local_d1c;
      uVar1 = local_d24;
      if (local_e9c != covered) {
        uVar3 = local_d24._4_4_;
        local_d24 = uVar1;
        uVar4 = local_d1c._4_4_;
        local_d1c = uVar2;
        uVar1 = local_d24;
        local_d24._4_4_ = uVar3;
        uVar2 = local_d1c;
        local_d1c._4_4_ = uVar4;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea64);
        uVar2 = local_d1c;
        uVar1 = local_d24;
        local_ee0 = local_f20;
        uVar3 = local_d24._4_4_;
        local_d24 = uVar1;
        uVar4 = local_d1c._4_4_;
        local_d1c = uVar2;
        uVar1 = local_d24;
        local_d24._4_4_ = uVar3;
        uVar2 = local_d1c;
        local_d1c._4_4_ = uVar4;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea64);
        uVar2 = local_d1c;
        uVar1 = local_d24;
        local_f28 = local_f68;
        uVar3 = local_d24._4_4_;
        local_d24 = uVar1;
        uVar4 = local_d1c._4_4_;
        local_d1c = uVar2;
        uVar1 = local_d24;
        local_d24._4_4_ = uVar3;
        uVar2 = local_d1c;
        local_d1c._4_4_ = uVar4;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea64);
        uVar2 = local_d1c;
        uVar1 = local_d24;
        local_f70 = local_fb0;
        local_d24 = uVar1;
        local_d1c = uVar2;
        if (local_ebc == regular) {
          uVar3 = local_d24._4_4_;
          uVar4 = local_d1c._4_4_;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::Range<amrex::Box>
                    ((Box *)CONCAT44(in_stack_ffffffffffffea64,
                                     CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_fb8 = local_fe0;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          while (local_d1c = uVar2, local_d24 = uVar1, uVar4 = local_d1c._4_4_,
                uVar3 = local_d24._4_4_, uVar1 = local_d24, local_d24._4_4_ = uVar3,
                uVar2 = local_d1c, local_d1c._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_ff8,&local_1010), uVar2 = local_d1c, uVar1 = local_d24,
                local_d24 = uVar1, local_d1c = uVar2, bVar5) {
            uVar3 = local_d24._4_4_;
            uVar4 = local_d1c._4_4_;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_102c,&local_ff8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_b50 = local_e58;
            local_b58 = local_ee0;
            local_b68 = &local_d2c;
            local_b70 = local_d38;
            local_c = 0;
            local_b24 = (undefined4)local_d2c;
            local_1c = 1;
            uStack_b20 = local_d2c._4_4_;
            local_c58 = local_d2c;
            local_2c = 2;
            local_c50._0_4_ = uVar1;
            local_38 = (long)&local_d24 + 4;
            local_3c = 0;
            local_afc = local_d24._4_4_;
            local_48 = (long)&local_d24 + 4;
            local_4c = 1;
            uStack_af8._0_4_ = uVar2;
            local_bb0 = CONCAT84(uVar2,local_d24._4_4_);
            local_58 = (long)&local_d24 + 4;
            local_5c = 2;
            local_ba8 = local_d1c._4_4_;
            local_c48 = local_d38;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            local_b9c = local_bb0;
            local_b94 = local_ba8;
            local_b90 = local_c58;
            local_b88._0_4_ = (undefined8)local_c50;
            local_b80 = local_c58;
            local_b78._0_4_ = (undefined8)local_c50;
            local_b48 = &local_102c;
            local_b40 = local_c58;
            local_b38._0_4_ = (undefined8)local_c50;
            local_b30 = local_b68;
            local_b1c._0_4_ = (undefined4)(undefined8)local_c50;
            local_b1c._4_8_ = local_bb0;
            local_b10 = local_ba8;
            local_b08 = local_b68;
            uStack_af8._4_4_ = local_ba8;
            local_28 = local_b68;
            local_18 = local_b68;
            local_8 = local_b68;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_c40,local_ee0,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_c00,local_b50,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_bc0 = local_b9c;
            local_bb8 = local_b94;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2face_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      ((Box *)in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4,
                       (anon_class_168_5_9f62599b *)in_stack_ffffffffffffeaa8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_ff8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
          }
          uVar3 = local_d24._4_4_;
          uVar4 = local_d1c._4_4_;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::Range<amrex::Box>
                    ((Box *)CONCAT44(in_stack_ffffffffffffea64,
                                     CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_1038 = local_1060;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          while (local_d1c = uVar2, local_d24 = uVar1, uVar4 = local_d1c._4_4_,
                uVar3 = local_d24._4_4_, uVar1 = local_d24, local_d24._4_4_ = uVar3,
                uVar2 = local_d1c, local_d1c._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_1078,&local_1090), uVar2 = local_d1c, uVar1 = local_d24,
                local_d24 = uVar1, local_d1c = uVar2, bVar5) {
            uVar3 = local_d24._4_4_;
            uVar4 = local_d1c._4_4_;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*(&local_10ac,&local_1078);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_9e8 = local_e58;
            local_9f0 = local_f28;
            local_a00 = &local_d2c;
            local_a08 = local_d38;
            local_6c = 0;
            local_9bc = (undefined4)local_d2c;
            local_7c = 1;
            uStack_9b8 = local_d2c._4_4_;
            local_af0 = local_d2c;
            local_8c = 2;
            local_ae8._0_4_ = uVar1;
            local_98 = (long)&local_d24 + 4;
            local_9c = 0;
            local_994 = local_d24._4_4_;
            local_a8 = (long)&local_d24 + 4;
            local_ac = 1;
            uStack_990._0_4_ = uVar2;
            local_a48 = CONCAT84(uVar2,local_d24._4_4_);
            local_b8 = (long)&local_d24 + 4;
            local_bc = 2;
            local_a40 = local_d1c._4_4_;
            local_ae0 = local_d38;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            local_a34 = local_a48;
            local_a2c = local_a40;
            local_a28 = local_af0;
            local_a20._0_4_ = (undefined8)local_ae8;
            local_a18 = local_af0;
            local_a10._0_4_ = (undefined8)local_ae8;
            local_9e0 = &local_10ac;
            local_9d8 = local_af0;
            local_9d0._0_4_ = (undefined8)local_ae8;
            local_9c8 = local_a00;
            local_9b4._0_4_ = (undefined4)(undefined8)local_ae8;
            local_9b4._4_8_ = local_a48;
            local_9a8 = local_a40;
            local_9a0 = local_a00;
            uStack_990._4_4_ = local_a40;
            local_88 = local_a00;
            local_78 = local_a00;
            local_68 = local_a00;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_ad8,local_f28,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_a98,local_9e8,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_a58 = local_a34;
            local_a50 = local_a2c;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2face_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      ((Box *)in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4,
                       (anon_class_168_5_9f625d5c *)in_stack_ffffffffffffeaa8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1078);
            uVar2 = local_d1c;
            uVar1 = local_d24;
          }
          uVar3 = local_d24._4_4_;
          uVar4 = local_d1c._4_4_;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::Range<amrex::Box>
                    ((Box *)CONCAT44(in_stack_ffffffffffffea64,
                                     CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_10b8 = local_10e0;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          while (local_d1c = uVar2, local_d24 = uVar1, uVar4 = local_d1c._4_4_,
                uVar3 = local_d24._4_4_, uVar1 = local_d24, local_d24._4_4_ = uVar3,
                uVar2 = local_d1c, local_d1c._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_10f8,(iterator *)(local_112c + 0x1c)), uVar2 = local_d1c,
                uVar1 = local_d24, bVar5) {
            in_stack_ffffffffffffead0 = (MFIter *)local_112c;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      ((Box *)in_stack_ffffffffffffead0,&local_10f8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_880 = local_e58;
            local_888 = local_f70;
            local_898 = &local_d2c;
            local_8a0 = local_d38;
            local_cc = 0;
            local_854 = (undefined4)local_d2c;
            local_dc = 1;
            uStack_850 = local_d2c._4_4_;
            local_988 = local_d2c;
            local_ec = 2;
            local_980._0_4_ = uVar1;
            local_f8 = (long)&local_d24 + 4;
            local_fc = 0;
            local_82c = local_d24._4_4_;
            local_108 = (long)&local_d24 + 4;
            local_10c = 1;
            uStack_828._0_4_ = uVar2;
            local_8e0 = CONCAT84(uVar2,local_d24._4_4_);
            local_118 = (long)&local_d24 + 4;
            local_11c = 2;
            local_8d8 = local_d1c._4_4_;
            local_978 = local_d38;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            local_8cc = local_8e0;
            local_8c4 = local_8d8;
            local_8c0 = local_988;
            local_8b8._0_4_ = (undefined8)local_980;
            local_8b0 = local_988;
            local_8a8._0_4_ = (undefined8)local_980;
            local_878 = in_stack_ffffffffffffead0;
            local_870 = local_988;
            local_868._0_4_ = (undefined8)local_980;
            local_860 = local_898;
            local_84c._0_4_ = (undefined4)(undefined8)local_980;
            local_84c._4_8_ = local_8e0;
            local_840 = local_8d8;
            local_838 = local_898;
            uStack_828._4_4_ = local_8d8;
            local_e8 = local_898;
            local_d8 = local_898;
            local_c8 = local_898;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_970,local_f70,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_930,local_880,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_8f0 = local_8cc;
            local_8e8 = local_8c4;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2face_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      ((Box *)in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4,
                       (anon_class_168_5_9f62611d *)in_stack_ffffffffffffeaa8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_10f8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
          }
        }
        else {
          uVar3 = local_d24._4_4_;
          uVar4 = local_d1c._4_4_;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     (size_type)mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          MultiCutFab::const_array
                    ((MultiCutFab *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_1138 = local_1178;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     (size_type)mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          MultiCutFab::const_array
                    ((MultiCutFab *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_1180 = local_11c0;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     (size_type)mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          MultiCutFab::const_array
                    ((MultiCutFab *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_11c8 = local_1208;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     (size_type)mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          MultiCutFab::const_array
                    ((MultiCutFab *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_1210 = local_1250;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     (size_type)mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          MultiCutFab::const_array
                    ((MultiCutFab *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_1258 = local_1298;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiCutFab_*,_3UL> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     (size_type)mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          MultiCutFab::const_array
                    ((MultiCutFab *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)),
                     mfi_00);
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_12a0 = local_12e0;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::Range<amrex::Box>
                    ((Box *)CONCAT44(in_stack_ffffffffffffea64,
                                     CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_12e8 = local_1310;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          while (local_d1c = uVar2, local_d24 = uVar1, uVar4 = local_d1c._4_4_,
                uVar3 = local_d24._4_4_, uVar1 = local_d24, local_d24._4_4_ = uVar3,
                uVar2 = local_d1c, local_d1c._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_1328,(iterator *)(local_135c + 0x1c)), uVar2 = local_d1c,
                uVar1 = local_d24, local_d24 = uVar1, local_d1c = uVar2, bVar5) {
            in_stack_ffffffffffffeab8 = (MFIter *)local_135c;
            uVar3 = local_d24._4_4_;
            uVar4 = local_d1c._4_4_;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      ((Box *)in_stack_ffffffffffffeab8,&local_1328);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_688 = local_e58;
            local_690 = local_1138;
            local_698 = local_1210;
            local_6a0 = local_ee0;
            local_6b0 = &local_d2c;
            local_6b8 = local_d38;
            local_12c = 0;
            local_65c = (undefined4)local_d2c;
            local_13c = 1;
            uStack_658 = local_d2c._4_4_;
            local_6d8 = local_d2c;
            local_14c = 2;
            local_6d0._0_4_ = uVar1;
            local_158 = (long)&local_d24 + 4;
            local_15c = 0;
            local_634 = local_d24._4_4_;
            local_168 = (long)&local_d24 + 4;
            local_16c = 1;
            uStack_630._0_4_ = uVar2;
            local_6f8 = CONCAT84(uVar2,local_d24._4_4_);
            local_178 = (long)&local_d24 + 4;
            local_17c = 2;
            local_6f0 = local_d1c._4_4_;
            in_stack_ffffffffffffeac0 = in_stack_ffffffffffffeab8;
            in_stack_ffffffffffffeacc = in_stack_00000008;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            local_6e4 = local_6f8;
            local_6dc = local_6f0;
            local_6c8 = local_6d8;
            local_6c0._0_4_ = (undefined8)local_6d0;
            local_680 = in_stack_ffffffffffffeab8;
            local_678 = local_6d8;
            local_670._0_4_ = (undefined8)local_6d0;
            local_668 = local_6b0;
            local_654._0_4_ = (undefined4)(undefined8)local_6d0;
            local_654._4_8_ = local_6f8;
            local_648 = local_6f0;
            local_640 = local_6b0;
            uStack_630._4_4_ = local_6f0;
            local_148 = local_6b0;
            local_138 = local_6b0;
            local_128 = local_6b0;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(local_820,local_1138,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_7e0,local_6a0,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_7a0 = local_6c8;
            local_798._0_4_ = (undefined8)local_6c0;
            local_790 = local_6b8;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_788,local_688,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_748 = local_6e4;
            local_740 = local_6dc;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_738,local_698,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2facecent_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      ((Box *)in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4,
                       in_stack_ffffffffffffeaa8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1328);
            uVar2 = local_d1c;
            uVar1 = local_d24;
          }
          uVar3 = local_d24._4_4_;
          uVar4 = local_d1c._4_4_;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::Range<amrex::Box>
                    ((Box *)CONCAT44(in_stack_ffffffffffffea64,
                                     CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          while (local_d1c = uVar2, local_d24 = uVar1, uVar4 = local_d1c._4_4_,
                uVar3 = local_d24._4_4_, uVar1 = local_d24, local_d24._4_4_ = uVar3,
                uVar2 = local_d1c, local_d1c._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_13a8,&local_13c0), uVar2 = local_d1c, uVar1 = local_d24,
                local_d24 = uVar1, local_d1c = uVar2, bVar5) {
            in_stack_ffffffffffffeaa8 = (anon_class_296_7_5d001a28 *)&stack0xffffffffffffec24;
            uVar3 = local_d24._4_4_;
            uVar4 = local_d1c._4_4_;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      ((Box *)in_stack_ffffffffffffeaa8,&local_13a8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_490 = local_e58;
            local_498 = local_1180;
            local_4a0 = local_1258;
            local_4a8 = local_f28;
            local_4b8 = &local_d2c;
            local_4c0 = local_d38;
            local_18c = 0;
            local_464 = (undefined4)local_d2c;
            local_19c = 1;
            uStack_460 = local_d2c._4_4_;
            local_4e0 = local_d2c;
            local_1ac = 2;
            local_4d8._0_4_ = uVar1;
            local_1b8 = (long)&local_d24 + 4;
            local_1bc = 0;
            local_43c = local_d24._4_4_;
            local_1c8 = (long)&local_d24 + 4;
            local_1cc = 1;
            uStack_438._0_4_ = uVar2;
            local_500 = CONCAT84(uVar2,local_d24._4_4_);
            local_1d8 = (long)&local_d24 + 4;
            local_1dc = 2;
            local_4f8 = local_d1c._4_4_;
            in_stack_ffffffffffffeab4 = in_stack_00000008;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            local_4ec = local_500;
            local_4e4 = local_4f8;
            local_4d0 = local_4e0;
            local_4c8._0_4_ = (undefined8)local_4d8;
            local_488 = in_stack_ffffffffffffeaa8;
            local_480 = local_4e0;
            local_478._0_4_ = (undefined8)local_4d8;
            local_470 = local_4b8;
            local_45c._0_4_ = (undefined4)(undefined8)local_4d8;
            local_45c._4_8_ = local_500;
            local_450 = local_4f8;
            local_448 = local_4b8;
            uStack_438._4_4_ = local_4f8;
            local_1a8 = local_4b8;
            local_198 = local_4b8;
            local_188 = local_4b8;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(local_628,local_1180,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_5e8,local_4a8,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_5a8 = local_4d0;
            local_5a0._0_4_ = (undefined8)local_4c8;
            local_598 = local_4c0;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_590,local_490,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_550 = local_4ec;
            local_548 = local_4e4;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_540,local_4a0,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2facecent_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      ((Box *)in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4,
                       (anon_class_296_7_939b2e09 *)in_stack_ffffffffffffeaa8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_13a8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
          }
          uVar3 = local_d24._4_4_;
          uVar4 = local_d1c._4_4_;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::Range<amrex::Box>
                    ((Box *)CONCAT44(in_stack_ffffffffffffea64,
                                     CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          local_13e8 = local_1410;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::begin
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          uVar3 = local_d24._4_4_;
          local_d24 = uVar1;
          uVar4 = local_d1c._4_4_;
          local_d1c = uVar2;
          uVar1 = local_d24;
          local_d24._4_4_ = uVar3;
          uVar2 = local_d1c;
          local_d1c._4_4_ = uVar4;
          Gpu::range_detail::range_impl<amrex::Box>::end
                    ((range_impl<amrex::Box> *)
                     CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
          uVar2 = local_d1c;
          uVar1 = local_d24;
          while (local_d1c = uVar2, local_d24 = uVar1, uVar4 = local_d1c._4_4_,
                uVar3 = local_d24._4_4_, uVar1 = local_d24, local_d24._4_4_ = uVar3,
                uVar2 = local_d1c, local_d1c._4_4_ = uVar4,
                bVar5 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                                  (&local_1428,&local_1440), uVar2 = local_d1c, uVar1 = local_d24,
                bVar5) {
            in_stack_ffffffffffffea90 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffeba4;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                      ((Box *)in_stack_ffffffffffffea90,&local_1428);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_298 = local_e58;
            local_2a0 = local_11c8;
            local_2a8 = local_12a0;
            local_2b0 = local_f70;
            local_2c0 = &local_d2c;
            local_2c8 = local_d38;
            local_1ec = 0;
            local_26c = (undefined4)local_d2c;
            local_1fc = 1;
            uStack_268 = local_d2c._4_4_;
            local_2e8 = local_d2c;
            local_20c = 2;
            local_2e0._0_4_ = uVar1;
            local_218 = (long)&local_d24 + 4;
            local_21c = 0;
            local_248 = local_d24._4_4_;
            local_228 = (long)&local_d24 + 4;
            local_22c = 1;
            uStack_244._0_4_ = uVar2;
            local_308 = CONCAT84(uVar2,local_d24._4_4_);
            local_238 = (long)&local_d24 + 4;
            local_23c = 2;
            local_300 = local_d1c._4_4_;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            local_2f4 = local_308;
            local_2ec = local_300;
            local_2d8 = local_2e8;
            local_2d0._0_4_ = (undefined8)local_2e0;
            local_290 = in_stack_ffffffffffffea90;
            local_288 = local_2e8;
            local_280._0_4_ = (undefined8)local_2e0;
            local_278 = local_2c0;
            local_264._0_4_ = (undefined4)(undefined8)local_2e0;
            local_264._4_8_ = local_308;
            local_258 = local_300;
            local_250 = local_2c0;
            uStack_244._4_4_ = local_300;
            local_208 = local_2c0;
            local_1f8 = local_2c0;
            local_1e8 = local_2c0;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(local_430,local_11c8,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_3f0,local_2b0,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_3b0 = local_2d8;
            local_3a8._0_4_ = (undefined8)local_2d0;
            local_3a0 = local_2c8;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_398,local_298,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            local_358 = local_2f4;
            local_350 = local_2ec;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            memcpy(auStack_348,local_2a8,0x3c);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Loop<amrex::eb_interp_cc2facecent_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                      ((Box *)in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab4,
                       (anon_class_296_7_ca3641ea *)in_stack_ffffffffffffeaa8);
            uVar2 = local_d1c;
            uVar1 = local_d24;
            uVar3 = local_d24._4_4_;
            local_d24 = uVar1;
            uVar4 = local_d1c._4_4_;
            local_d1c = uVar2;
            uVar1 = local_d24;
            local_d24._4_4_ = uVar3;
            uVar2 = local_d1c;
            local_d1c._4_4_ = uVar4;
            Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_1428);
            uVar2 = local_d1c;
            uVar1 = local_d24;
          }
        }
      }
      local_d1c = uVar2;
      local_d24 = uVar1;
      uVar4 = local_d1c._4_4_;
      uVar3 = local_d24._4_4_;
      uVar1 = local_d24;
      local_d24._4_4_ = uVar3;
      uVar2 = local_d1c;
      local_d1c._4_4_ = uVar4;
      MFIter::operator++(&local_db0);
      uVar2 = local_d1c;
      uVar1 = local_d24;
    }
    uVar3 = local_d24._4_4_;
    uVar4 = local_d1c._4_4_;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    MFIter::~MFIter((MFIter *)
                    CONCAT44(in_stack_ffffffffffffea64,CONCAT22(in_stack_ffffffffffffea62,uVar9)));
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar10 = (undefined1)((ulong)in_stack_ffffffffffffea70 >> 0x38);
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    Geometry::periodicity((Geometry *)in_stack_ffffffffffffea90);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar11 = 0;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffea80,(Periodicity *)(ulong)in_stack_ffffffffffffea78,
               (bool)uVar10);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    uVar10 = local_cb0._7_1_;
    Geometry::periodicity((Geometry *)in_stack_ffffffffffffea90);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffea80,(Periodicity *)CONCAT44(uVar11,in_stack_ffffffffffffea78),
               (bool)uVar10);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    Geometry::periodicity((Geometry *)in_stack_ffffffffffffea90);
    uVar2 = local_d1c;
    uVar1 = local_d24;
    uVar3 = local_d24._4_4_;
    local_d24 = uVar1;
    uVar4 = local_d1c._4_4_;
    local_d1c = uVar2;
    uVar1 = local_d24;
    local_d24._4_4_ = uVar3;
    uVar2 = local_d1c;
    local_d1c._4_4_ = uVar4;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (local_cb8,(Periodicity *)CONCAT44(uVar11,in_stack_ffffffffffffea78),(bool)uVar10);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
EB_interp_CC_to_FaceCentroid (const MultiFab& cc,
                              AMREX_D_DECL( MultiFab& fc_x,
                                            MultiFab& fc_y,
                                            MultiFab& fc_z),
                              int scomp, int dcomp, int ncomp,
                              const Geometry& a_geom,
                              const Vector<BCRec>& a_bcs)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(cc.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& area = factory.getAreaFrac();
    const auto& fcent = factory.getFaceCent();

    AMREX_ALWAYS_ASSERT(a_bcs.size() == ncomp );

    Box domain(a_geom.Domain());

    const int nghost(4);

   // Initialize edge state
    AMREX_D_TERM(fc_x.setVal(1e30_rt,dcomp,ncomp);,
                 fc_y.setVal(1e30_rt,dcomp,ncomp);,
                 fc_z.setVal(1e30_rt,dcomp,ncomp));

    BCRec const* d_bcs;
#ifdef AMREX_USE_GPU
    Gpu::DeviceVector<BCRec> dv_bcs(ncomp);
    if (Gpu::inLaunchRegion())
    {
        Gpu::copy(Gpu::hostToDevice, a_bcs.begin(), a_bcs.begin()+ncomp, dv_bcs.begin());
        d_bcs = dv_bcs.dataPtr();
    }
    else
#endif
    {
        d_bcs = a_bcs.dataPtr();
    }

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cc, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.tilebox();
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2));
        const auto& ccfab = cc.array(mfi,scomp);
        const auto fabtyp = flags[mfi].getType(amrex::grow(vbx,0));
        const auto fabtyp_ghost = flags[mfi].getType(amrex::grow(vbx,nghost));

        if (fabtyp != FabType::covered)
        {
            AMREX_D_TERM(Array4<Real> const& edg_x = fc_x.array(mfi,dcomp);,
                         Array4<Real> const& edg_y = fc_y.array(mfi,dcomp);,
                         Array4<Real> const& edg_z = fc_z.array(mfi,dcomp));

            if (fabtyp_ghost == FabType::regular )
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2face_x(txbx, ccfab, edg_x, ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2face_y(tybx, ccfab, edg_y, ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2face_z(tzbx, ccfab, edg_z, ncomp, domain, d_bcs);
                     });
            }
            else
            {
                AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                             Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                             Array4<Real const> const& apzfab = area[2]->const_array(mfi));
                AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                             Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                             Array4<Real const> const& fcz = fcent[2]->const_array(mfi));

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2facecent_x(txbx, ccfab, apxfab, fcx, edg_x,
                                                 ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2facecent_y(tybx, ccfab, apyfab, fcy, edg_y,
                                                 ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2facecent_z(tzbx, ccfab, apzfab, fcz, edg_z,
                                                 ncomp, domain, d_bcs);
                     });
            }
        }
    }

    fc_x.FillBoundary(a_geom.periodicity());
    fc_y.FillBoundary(a_geom.periodicity());
#if ( AMREX_SPACEDIM == 3 )
    fc_z.FillBoundary(a_geom.periodicity());
#endif

}